

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

int float32_is_quiet_nan_mips64el(float32 a_,float_status *status)

{
  bool bVar1;
  uint32_t a;
  
  if (status->snan_bit_is_one == '\0') {
    bVar1 = 0xff7fffff < a_ * 2;
  }
  else {
    bVar1 = (a_ & 0x3fffff) != 0 && (a_ & 0x7fc00000) == 0x7f800000;
  }
  return (int)bVar1;
}

Assistant:

int float32_is_quiet_nan(float32 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float32_is_any_nan(a_);
#else
    uint32_t a = float32_val(a_);
    if (snan_bit_is_one(status)) {
        return (((a >> 22) & 0x1FF) == 0x1FE) && (a & 0x003FFFFF);
    } else {
        return ((uint32_t)(a << 1) >= 0xFF800000);
    }
#endif
}